

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O2

void __thiscall
ki::protocol::dml::MessageTemplate::set_access_level(MessageTemplate *this,uint8_t access_level)

{
  Record *this_00;
  Field<unsigned_char> *pFVar1;
  allocator local_39;
  string local_38;
  
  this_00 = this->m_record;
  std::__cxx11::string::string((string *)&local_38,"_MsgAccessLvl",&local_39);
  pFVar1 = ki::dml::Record::add_field<unsigned_char>(this_00,&local_38,true);
  pFVar1->m_value = access_level;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void MessageTemplate::set_access_level(uint8_t access_level)
	{
		m_record->add_field<ki::dml::UBYT>("_MsgAccessLvl")->set_value(access_level);
	}